

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write_char<char,fmt::v10::appender>
                   (appender out,char value,format_specs<char> *specs)

{
  appender aVar1;
  anon_class_2_2_bf5026b7 local_3a;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_38;
  undefined1 local_29;
  format_specs<char> *pfStack_28;
  bool is_debug;
  format_specs<char> *specs_local;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bStack_18;
  char value_local;
  appender out_local;
  
  local_3a.is_debug = specs->type == debug;
  local_3a.value = value;
  local_38 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  local_29 = local_3a.is_debug;
  pfStack_28 = specs;
  specs_local._7_1_ = value;
  bStack_18 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  aVar1 = write_padded<(fmt::v10::align::type)1,fmt::v10::appender,char,fmt::v10::detail::write_char<char,fmt::v10::appender>(fmt::v10::appender,char,fmt::v10::format_specs<char>const&)::_lambda(fmt::v10::appender)_1_>
                    (out,specs,1,&local_3a);
  return (appender)
         aVar1.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR auto write_char(OutputIt out, Char value,
                              const format_specs<Char>& specs) -> OutputIt {
  bool is_debug = specs.type == presentation_type::debug;
  return write_padded(out, specs, 1, [=](reserve_iterator<OutputIt> it) {
    if (is_debug) return write_escaped_char(it, value);
    *it++ = value;
    return it;
  });
}